

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * gpt_random_prompt_abi_cxx11_(mt19937 *rng)

{
  result_type rVar1;
  string *in_RDI;
  int r;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff90;
  allocator<char> *paVar2;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  undefined1 local_25 [37];
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(in_stack_ffffffffffffff60);
  local_25._17_4_ = (int)rVar1 + (int)(rVar1 / 10) * -10;
  switch(local_25._17_4_) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)(local_25 + 0x10));
    break;
  case 1:
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_25;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 2:
    paVar2 = &local_26;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)paVar2,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    paVar2 = &local_27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,paVar2);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_2d);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_2e);
  }
  return in_RDI;
}

Assistant:

std::string gpt_random_prompt(std::mt19937 & rng) {
    const int r = rng() % 10;
    switch (r) {
        case 0: return "So";
        case 1: return "Once upon a time";
        case 2: return "When";
        case 3: return "The";
        case 4: return "After";
        case 5: return "If";
        case 6: return "import";
        case 7: return "He";
        case 8: return "She";
        case 9: return "They";
    }

    return "The";
}